

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

StringRef __thiscall
Catch::Generators::GeneratorUntypedBase::currentElementAsString(GeneratorUntypedBase *this)

{
  size_type sVar1;
  StringRef SVar2;
  string asStack_38 [32];
  
  sVar1 = (this->m_stringReprCache)._M_string_length;
  if (sVar1 == 0) {
    (*this->_vptr_GeneratorUntypedBase[1])(asStack_38,this);
    std::__cxx11::string::operator=((string *)&this->m_stringReprCache,asStack_38);
    std::__cxx11::string::~string(asStack_38);
    sVar1 = (this->m_stringReprCache)._M_string_length;
  }
  SVar2.m_size = sVar1;
  SVar2.m_start = (this->m_stringReprCache)._M_dataplus._M_p;
  return SVar2;
}

Assistant:

StringRef GeneratorUntypedBase::currentElementAsString() const {
            if ( m_stringReprCache.empty() ) {
                m_stringReprCache = stringifyImpl();
            }
            return m_stringReprCache;
        }